

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-matchers.h
# Opt level: O1

bool __thiscall
testing::internal::
UnorderedElementsAreMatcherImpl<const_phmap::priv::(anonymous_namespace)::BadTable_&>::
MatchAndExplain(UnorderedElementsAreMatcherImpl<const_phmap::priv::(anonymous_namespace)::BadTable_&>
                *this,BadTable *container,MatchResultListener *listener)

{
  char cVar1;
  long *plVar2;
  uint uVar3;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  int iVar6;
  int iVar7;
  int iVar8;
  int iVar9;
  undefined1 auVar10 [11];
  undefined1 auVar11 [12];
  undefined1 auVar12 [13];
  undefined1 auVar13 [14];
  char *pcVar14;
  pointer pbVar15;
  pointer pbVar16;
  bool bVar17;
  pointer pcVar18;
  uint uVar19;
  size_t sVar20;
  long lVar21;
  size_t sVar22;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar23;
  pointer pbVar24;
  long lVar25;
  pointer pMVar26;
  anon_union_8_1_a8a14541_for_iterator_1 aVar27;
  char in_XMM1_Ba;
  char in_XMM1_Bb;
  char in_XMM1_Bc;
  char in_XMM1_Bd;
  char in_XMM1_Be;
  char in_XMM1_Bf;
  char in_XMM1_Bg;
  char in_XMM1_Bh;
  char in_XMM1_Bi;
  char in_XMM1_Bj;
  char in_XMM1_Bk;
  char in_XMM1_Bl;
  char in_XMM1_Bm;
  char in_XMM1_Bn;
  char in_XMM1_Bo;
  byte in_XMM1_Bp;
  iterator iVar28;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  element_printouts;
  vector<char,_std::allocator<char>_> did_match;
  MatchMatrix matrix;
  DummyMatchResultListener dummy;
  allocator_type local_e1;
  MatchResultListener *local_e0;
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  local_d8;
  char *local_b8;
  size_t local_b0;
  undefined1 local_a8 [16];
  pointer local_98;
  string local_88;
  MatchMatrix local_68;
  MatchResultListener local_40;
  
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  local_d8.
  super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_e0 = listener;
  iVar28 = (iterator)
           phmap::priv::
           raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
           ::begin(&container->
                    super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
                  );
  local_b8 = (container->
             super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
             ).ctrl_ + (container->
                       super_raw_hash_set<phmap::priv::(anonymous_namespace)::IntPolicy,_phmap::priv::(anonymous_namespace)::BadFastHash,_std::equal_to<int>,_std::allocator<int>_>
                       ).capacity_;
  pbVar15 = local_d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_start;
  pbVar16 = local_d8.
            super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
            ._M_impl.super__Vector_impl_data._M_finish;
  if (local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_finish !=
      local_d8.
      super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
      ._M_impl.super__Vector_impl_data._M_start) {
    paVar23 = &(local_d8.
                super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                ._M_impl.super__Vector_impl_data._M_start)->field_2;
    do {
      plVar2 = (long *)(((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                        (paVar23 + -1))->_M_dataplus)._M_p;
      if (paVar23 !=
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)plVar2) {
        operator_delete(plVar2,paVar23->_M_allocated_capacity + 1);
      }
      pbVar24 = (pointer)(paVar23 + 1);
      paVar23 = paVar23 + 2;
    } while (pbVar24 != pbVar16);
    local_d8.
    super__Vector_base<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
    ._M_impl.super__Vector_impl_data._M_finish = pbVar15;
  }
  local_a8 = (undefined1  [16])0x0;
  sVar22 = 0;
  local_98 = (pointer)0x0;
  local_40.stream_ = (ostream *)0x0;
  local_40._vptr_MatchResultListener = (_func_int **)&PTR__MatchResultListener_001bc270;
  if (iVar28.ctrl_ != local_b8) {
    sVar22 = 0;
    do {
      aVar27 = iVar28.field_1;
      if (local_e0->stream_ != (ostream *)0x0) {
        PrintToString<long>(&local_88,aVar27.slot_);
        std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>::
        emplace_back<std::__cxx11::string>
                  ((vector<std::__cxx11::string,std::allocator<std::__cxx11::string>> *)&local_d8,
                   &local_88);
        if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
             *)CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_) !=
            &local_88.field_2) {
          operator_delete((undefined1 *)
                          CONCAT71(local_88._M_dataplus._M_p._1_7_,local_88._M_dataplus._M_p._0_1_),
                          local_88.field_2._M_allocated_capacity + 1);
        }
      }
      pMVar26 = (this->matchers_).
                super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
                ._M_impl.super__Vector_impl_data._M_start;
      local_b0 = sVar22;
      if ((this->matchers_).
          super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
          ._M_impl.super__Vector_impl_data._M_finish != pMVar26) {
        lVar25 = 0;
        lVar21 = 0;
        do {
          local_88._M_dataplus._M_p._0_1_ =
               MatcherBase<const_long_&>::MatchAndExplain
                         ((MatcherBase<const_long_&> *)
                          ((long)&(pMVar26->super_MatcherBase<const_long_&>).
                                  super_MatcherDescriberInterface._vptr_MatcherDescriberInterface +
                          lVar25),aVar27.slot_,&local_40);
          std::vector<char,_std::allocator<char>_>::emplace_back<char>
                    ((vector<char,_std::allocator<char>_> *)local_a8,(char *)&local_88);
          lVar21 = lVar21 + 1;
          pMVar26 = (this->matchers_).
                    super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
                    ._M_impl.super__Vector_impl_data._M_start;
          lVar25 = lVar25 + 0x18;
        } while (lVar21 != ((long)(this->matchers_).
                                  super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish - (long)pMVar26 >> 3) *
                           -0x5555555555555555);
      }
      aVar27.slot_ = aVar27.slot_ + 1;
      cVar1 = iVar28.ctrl_[1];
      pcVar14 = iVar28.ctrl_ + 1;
      while (cVar1 < -1) {
        iVar6 = -(uint)(CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))) ==
                       CONCAT13(in_XMM1_Bd,CONCAT12(in_XMM1_Bc,CONCAT11(in_XMM1_Bb,in_XMM1_Ba))));
        iVar7 = -(uint)(CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))) ==
                       CONCAT13(in_XMM1_Bh,CONCAT12(in_XMM1_Bg,CONCAT11(in_XMM1_Bf,in_XMM1_Be))));
        iVar8 = -(uint)(CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))) ==
                       CONCAT13(in_XMM1_Bl,CONCAT12(in_XMM1_Bk,CONCAT11(in_XMM1_Bj,in_XMM1_Bi))));
        iVar9 = -(uint)(CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))) ==
                       CONCAT13(in_XMM1_Bp,CONCAT12(in_XMM1_Bo,CONCAT11(in_XMM1_Bn,in_XMM1_Bm))));
        in_XMM1_Ba = -(*pcVar14 < (char)iVar6);
        in_XMM1_Bb = -(pcVar14[1] < (char)((uint)iVar6 >> 8));
        in_XMM1_Bc = -(pcVar14[2] < (char)((uint)iVar6 >> 0x10));
        in_XMM1_Bd = -(pcVar14[3] < (char)((uint)iVar6 >> 0x18));
        in_XMM1_Be = -(pcVar14[4] < (char)iVar7);
        in_XMM1_Bf = -(pcVar14[5] < (char)((uint)iVar7 >> 8));
        in_XMM1_Bg = -(pcVar14[6] < (char)((uint)iVar7 >> 0x10));
        in_XMM1_Bh = -(pcVar14[7] < (char)((uint)iVar7 >> 0x18));
        in_XMM1_Bi = -(pcVar14[8] < (char)iVar8);
        in_XMM1_Bj = -(pcVar14[9] < (char)((uint)iVar8 >> 8));
        in_XMM1_Bk = -(pcVar14[10] < (char)((uint)iVar8 >> 0x10));
        in_XMM1_Bl = -(pcVar14[0xb] < (char)((uint)iVar8 >> 0x18));
        in_XMM1_Bm = -(pcVar14[0xc] < (char)iVar9);
        in_XMM1_Bn = -(pcVar14[0xd] < (char)((uint)iVar9 >> 8));
        in_XMM1_Bo = -(pcVar14[0xe] < (char)((uint)iVar9 >> 0x10));
        in_XMM1_Bp = -(pcVar14[0xf] < (char)((uint)iVar9 >> 0x18));
        auVar4[1] = in_XMM1_Bb;
        auVar4[0] = in_XMM1_Ba;
        auVar4[2] = in_XMM1_Bc;
        auVar4[3] = in_XMM1_Bd;
        auVar4[4] = in_XMM1_Be;
        auVar4[5] = in_XMM1_Bf;
        auVar4[6] = in_XMM1_Bg;
        auVar4[7] = in_XMM1_Bh;
        auVar4[8] = in_XMM1_Bi;
        auVar4[9] = in_XMM1_Bj;
        auVar4[10] = in_XMM1_Bk;
        auVar4[0xb] = in_XMM1_Bl;
        auVar4[0xc] = in_XMM1_Bm;
        auVar4[0xd] = in_XMM1_Bn;
        auVar4[0xe] = in_XMM1_Bo;
        auVar4[0xf] = in_XMM1_Bp;
        auVar5[1] = in_XMM1_Bb;
        auVar5[0] = in_XMM1_Ba;
        auVar5[2] = in_XMM1_Bc;
        auVar5[3] = in_XMM1_Bd;
        auVar5[4] = in_XMM1_Be;
        auVar5[5] = in_XMM1_Bf;
        auVar5[6] = in_XMM1_Bg;
        auVar5[7] = in_XMM1_Bh;
        auVar5[8] = in_XMM1_Bi;
        auVar5[9] = in_XMM1_Bj;
        auVar5[10] = in_XMM1_Bk;
        auVar5[0xb] = in_XMM1_Bl;
        auVar5[0xc] = in_XMM1_Bm;
        auVar5[0xd] = in_XMM1_Bn;
        auVar5[0xe] = in_XMM1_Bo;
        auVar5[0xf] = in_XMM1_Bp;
        auVar13[1] = in_XMM1_Bd;
        auVar13[0] = in_XMM1_Bc;
        auVar13[2] = in_XMM1_Be;
        auVar13[3] = in_XMM1_Bf;
        auVar13[4] = in_XMM1_Bg;
        auVar13[5] = in_XMM1_Bh;
        auVar13[6] = in_XMM1_Bi;
        auVar13[7] = in_XMM1_Bj;
        auVar13[8] = in_XMM1_Bk;
        auVar13[9] = in_XMM1_Bl;
        auVar13[10] = in_XMM1_Bm;
        auVar13[0xb] = in_XMM1_Bn;
        auVar13[0xc] = in_XMM1_Bo;
        auVar13[0xd] = in_XMM1_Bp;
        auVar12[1] = in_XMM1_Be;
        auVar12[0] = in_XMM1_Bd;
        auVar12[2] = in_XMM1_Bf;
        auVar12[3] = in_XMM1_Bg;
        auVar12[4] = in_XMM1_Bh;
        auVar12[5] = in_XMM1_Bi;
        auVar12[6] = in_XMM1_Bj;
        auVar12[7] = in_XMM1_Bk;
        auVar12[8] = in_XMM1_Bl;
        auVar12[9] = in_XMM1_Bm;
        auVar12[10] = in_XMM1_Bn;
        auVar12[0xb] = in_XMM1_Bo;
        auVar12[0xc] = in_XMM1_Bp;
        auVar11[1] = in_XMM1_Bf;
        auVar11[0] = in_XMM1_Be;
        auVar11[2] = in_XMM1_Bg;
        auVar11[3] = in_XMM1_Bh;
        auVar11[4] = in_XMM1_Bi;
        auVar11[5] = in_XMM1_Bj;
        auVar11[6] = in_XMM1_Bk;
        auVar11[7] = in_XMM1_Bl;
        auVar11[8] = in_XMM1_Bm;
        auVar11[9] = in_XMM1_Bn;
        auVar11[10] = in_XMM1_Bo;
        auVar11[0xb] = in_XMM1_Bp;
        auVar10[1] = in_XMM1_Bg;
        auVar10[0] = in_XMM1_Bf;
        auVar10[2] = in_XMM1_Bh;
        auVar10[3] = in_XMM1_Bi;
        auVar10[4] = in_XMM1_Bj;
        auVar10[5] = in_XMM1_Bk;
        auVar10[6] = in_XMM1_Bl;
        auVar10[7] = in_XMM1_Bm;
        auVar10[8] = in_XMM1_Bn;
        auVar10[9] = in_XMM1_Bo;
        auVar10[10] = in_XMM1_Bp;
        uVar19 = (ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                          (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                          (ushort)(SUB141(auVar13 >> 7,0) & 1) << 2 |
                          (ushort)(SUB131(auVar12 >> 7,0) & 1) << 3 |
                          (ushort)(SUB121(auVar11 >> 7,0) & 1) << 4 |
                          (ushort)(SUB111(auVar10 >> 7,0) & 1) << 5 |
                          (ushort)((byte)(CONCAT19(in_XMM1_Bp,
                                                   CONCAT18(in_XMM1_Bo,
                                                            CONCAT17(in_XMM1_Bn,
                                                                     CONCAT16(in_XMM1_Bm,
                                                                              CONCAT15(in_XMM1_Bl,
                                                                                       CONCAT14(
                                                  in_XMM1_Bk,
                                                  CONCAT13(in_XMM1_Bj,
                                                           CONCAT12(in_XMM1_Bi,
                                                                    CONCAT11(in_XMM1_Bh,in_XMM1_Bg))
                                                          ))))))) >> 7) & 1) << 6 |
                          (ushort)((byte)(CONCAT18(in_XMM1_Bp,
                                                   CONCAT17(in_XMM1_Bo,
                                                            CONCAT16(in_XMM1_Bn,
                                                                     CONCAT15(in_XMM1_Bm,
                                                                              CONCAT14(in_XMM1_Bl,
                                                                                       CONCAT13(
                                                  in_XMM1_Bk,
                                                  CONCAT12(in_XMM1_Bj,
                                                           CONCAT11(in_XMM1_Bi,in_XMM1_Bh)))))))) >>
                                         7) & 1) << 7 | (ushort)(in_XMM1_Bp >> 7) << 0xf) + 1;
        uVar3 = 0;
        if (uVar19 != 0) {
          for (; (uVar19 >> uVar3 & 1) == 0; uVar3 = uVar3 + 1) {
          }
        }
        aVar27.slot_ = aVar27.slot_ + uVar3;
        cVar1 = pcVar14[uVar3];
        pcVar14 = pcVar14 + uVar3;
      }
      iVar28.field_1.slot_ = aVar27.slot_;
      iVar28.ctrl_ = pcVar14;
      sVar22 = local_b0 + 1;
    } while (pcVar14 != local_b8);
  }
  local_68.num_matchers_ =
       ((long)(this->matchers_).
              super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
              ._M_impl.super__Vector_impl_data._M_finish -
        (long)(this->matchers_).
              super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
              ._M_impl.super__Vector_impl_data._M_start >> 3) * -0x5555555555555555;
  local_88._M_dataplus._M_p._0_1_ = 0;
  local_68.num_elements_ = sVar22;
  std::vector<char,_std::allocator<char>_>::vector
            (&local_68.matched_,local_68.num_matchers_ * sVar22,(value_type_conflict1 *)&local_88,
             &local_e1);
  if (sVar22 != 0) {
    sVar20 = 0;
    pcVar18 = (pointer)local_a8._0_8_;
    do {
      if ((this->matchers_).
          super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
          ._M_impl.super__Vector_impl_data._M_finish !=
          (this->matchers_).
          super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
          ._M_impl.super__Vector_impl_data._M_start) {
        lVar21 = 0;
        do {
          local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
          super__Vector_impl_data._M_start[lVar21 + local_68.num_matchers_ * sVar20] =
               pcVar18[lVar21] != '\0';
          lVar21 = lVar21 + 1;
        } while (lVar21 != ((long)(this->matchers_).
                                  super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
                                  ._M_impl.super__Vector_impl_data._M_finish -
                            (long)(this->matchers_).
                                  super__Vector_base<testing::Matcher<const_long_&>,_std::allocator<testing::Matcher<const_long_&>_>_>
                                  ._M_impl.super__Vector_impl_data._M_start >> 3) *
                           -0x5555555555555555);
        pcVar18 = pcVar18 + lVar21;
      }
      sVar20 = sVar20 + 1;
    } while (sVar20 != sVar22);
  }
  if ((pointer)local_a8._0_8_ != (pointer)0x0) {
    operator_delete((void *)local_a8._0_8_,(long)local_98 - local_a8._0_8_);
  }
  bVar17 = UnorderedElementsAreMatcherImplBase::VerifyMatchMatrix
                     (&this->super_UnorderedElementsAreMatcherImplBase,&local_d8,&local_68,local_e0)
  ;
  if (bVar17) {
    bVar17 = UnorderedElementsAreMatcherImplBase::FindPairing
                       (&this->super_UnorderedElementsAreMatcherImplBase,&local_68,local_e0);
  }
  else {
    bVar17 = false;
  }
  if (local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
      super__Vector_impl_data._M_start != (pointer)0x0) {
    operator_delete(local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                    super__Vector_impl_data._M_start,
                    (long)local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_end_of_storage -
                    (long)local_68.matched_.super__Vector_base<char,_std::allocator<char>_>._M_impl.
                          super__Vector_impl_data._M_start);
  }
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector(&local_d8);
  return bVar17;
}

Assistant:

bool MatchAndExplain(Container container,
                       MatchResultListener* listener) const override {
    StlContainerReference stl_container = View::ConstReference(container);
    ::std::vector<std::string> element_printouts;
    MatchMatrix matrix =
        AnalyzeElements(stl_container.begin(), stl_container.end(),
                        &element_printouts, listener);

    return VerifyMatchMatrix(element_printouts, matrix, listener) &&
           FindPairing(matrix, listener);
  }